

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flatten_dependent_join.cpp
# Opt level: O1

void __thiscall
duckdb::FlattenDependentJoins::FlattenDependentJoins
          (FlattenDependentJoins *this,Binder *binder,
          vector<duckdb::CorrelatedColumnInfo,_true> *correlated,bool perform_delim,bool any_join)

{
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *pvVar1;
  const_reference __k;
  mapped_type *pmVar2;
  size_type __n;
  
  this->binder = binder;
  *(undefined4 *)&(this->base_binding).table_index = 0xffffffff;
  *(undefined4 *)((long)&(this->base_binding).table_index + 4) = 0xffffffff;
  *(undefined4 *)&(this->base_binding).column_index = 0xffffffff;
  *(undefined4 *)((long)&(this->base_binding).column_index + 4) = 0xffffffff;
  this->delim_offset = 0xffffffffffffffff;
  (this->has_correlated_expressions)._M_h._M_buckets =
       &(this->has_correlated_expressions)._M_h._M_single_bucket;
  (this->has_correlated_expressions)._M_h._M_bucket_count = 1;
  (this->has_correlated_expressions)._M_h._M_before_begin = (_Hash_node_base *)0x0;
  (this->has_correlated_expressions)._M_h._M_element_count = 0;
  (this->has_correlated_expressions)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  *(undefined1 (*) [16])&(this->has_correlated_expressions)._M_h._M_rehash_policy._M_next_resize =
       (undefined1  [16])0x0;
  (this->correlated_map)._M_h._M_buckets = &(this->correlated_map)._M_h._M_single_bucket;
  (this->correlated_map)._M_h._M_bucket_count = 1;
  (this->correlated_map)._M_h._M_before_begin = (_Hash_node_base *)0x0;
  (this->correlated_map)._M_h._M_element_count = 0;
  (this->correlated_map)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  *(undefined1 (*) [16])&(this->correlated_map)._M_h._M_rehash_policy._M_next_resize =
       (undefined1  [16])0x0;
  (this->replacement_map)._M_h._M_buckets = &(this->replacement_map)._M_h._M_single_bucket;
  (this->replacement_map)._M_h._M_bucket_count = 1;
  (this->replacement_map)._M_h._M_before_begin = (_Hash_node_base *)0x0;
  (this->replacement_map)._M_h._M_element_count = 0;
  (this->replacement_map)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  *(undefined1 (*) [16])&(this->replacement_map)._M_h._M_rehash_policy._M_next_resize =
       (undefined1  [16])0x0;
  this->correlated_columns = correlated;
  pvVar1 = &(this->delim_types).
            super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>;
  (pvVar1->super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (pvVar1->super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->delim_types).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->perform_delim = perform_delim;
  this->any_join = any_join;
  if ((correlated->
      super_vector<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>).
      super__Vector_base<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (correlated->
      super_vector<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>).
      super__Vector_base<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    __n = 0;
    do {
      __k = vector<duckdb::CorrelatedColumnInfo,_true>::operator[](correlated,__n);
      pmVar2 = ::std::__detail::
               _Map_base<duckdb::ColumnBinding,_std::pair<const_duckdb::ColumnBinding,_unsigned_long>,_std::allocator<std::pair<const_duckdb::ColumnBinding,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::ColumnBindingEquality,_duckdb::ColumnBindingHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               ::operator[]((_Map_base<duckdb::ColumnBinding,_std::pair<const_duckdb::ColumnBinding,_unsigned_long>,_std::allocator<std::pair<const_duckdb::ColumnBinding,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::ColumnBindingEquality,_duckdb::ColumnBindingHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                             *)&this->correlated_map,&__k->binding);
      *pmVar2 = __n;
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::push_back
                (&(this->delim_types).
                  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>,&__k->type
                );
      correlated = this->correlated_columns;
      __n = __n + 1;
    } while (__n < (ulong)(((long)(correlated->
                                  super_vector<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>
                                  ).
                                  super__Vector_base<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(correlated->
                                  super_vector<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>
                                  ).
                                  super__Vector_base<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>
                                  ._M_impl.super__Vector_impl_data._M_start >> 4) *
                          -0x3333333333333333));
  }
  return;
}

Assistant:

FlattenDependentJoins::FlattenDependentJoins(Binder &binder, const vector<CorrelatedColumnInfo> &correlated,
                                             bool perform_delim, bool any_join)
    : binder(binder), delim_offset(DConstants::INVALID_INDEX), correlated_columns(correlated),
      perform_delim(perform_delim), any_join(any_join) {
	for (idx_t i = 0; i < correlated_columns.size(); i++) {
		auto &col = correlated_columns[i];
		correlated_map[col.binding] = i;
		delim_types.push_back(col.type);
	}
}